

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall
el::Configurations::Configurations
          (Configurations *this,string *configurationFile,bool useDefaultsForRemaining,
          Configurations *base)

{
  pointer pcVar1;
  
  (this->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
  super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  .m_list.super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
  super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  .m_list.super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
  super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  .m_list.super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
  super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_001fa0b8;
  (this->m_configurationFile)._M_dataplus._M_p = (pointer)&(this->m_configurationFile).field_2;
  pcVar1 = (configurationFile->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_configurationFile,pcVar1,
             pcVar1 + configurationFile->_M_string_length);
  this->m_isFromFile = false;
  parseFromFile(this,configurationFile,base);
  if (useDefaultsForRemaining) {
    setRemainingToDefault(this);
  }
  return;
}

Assistant:

Configurations::Configurations(const std::string& configurationFile, bool useDefaultsForRemaining,
                               Configurations* base) :
  m_configurationFile(configurationFile),
  m_isFromFile(false) {
  parseFromFile(configurationFile, base);
  if (useDefaultsForRemaining) {
    setRemainingToDefault();
  }
}